

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

void __thiscall FIX::ScreenLog::ScreenLog(ScreenLog *this,bool incoming,bool outgoing,bool event)

{
  allocator<char> local_29;
  
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__ScreenLog_001ef508;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_prefix,"GLOBAL",&local_29);
  UtcTimeStamp::UtcTimeStamp(&this->m_time);
  this->m_incoming = incoming;
  this->m_outgoing = outgoing;
  this->m_event = event;
  return;
}

Assistant:

ScreenLog( bool incoming, bool outgoing, bool event )
: m_prefix( "GLOBAL" ),
  m_incoming( incoming ), m_outgoing( outgoing ), m_event( event ) {}